

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

int retry_control_set_option(RETRY_CONTROL_HANDLE retry_control_handle,char *name,void *value)

{
  int iVar1;
  OPTIONHANDLER_RESULT OVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  uint cast_value_1;
  LOGGER_LOG l_1;
  uint cast_value;
  RETRY_CONTROL_INSTANCE *retry_control;
  LOGGER_LOG l;
  int result;
  void *value_local;
  char *name_local;
  RETRY_CONTROL_HANDLE retry_control_handle_local;
  
  if (((retry_control_handle == (RETRY_CONTROL_HANDLE)0x0) || (name == (char *)0x0)) ||
     (value == (void *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_set_option",0x18d,1,
                "Failed to set option (either retry_state_handle (%p), name (%p) or value (%p) are NULL)"
                ,retry_control_handle,name,value);
    }
    l._4_4_ = 0x18e;
  }
  else {
    iVar1 = strcmp(RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS,name);
    if (iVar1 == 0) {
      if (*value == 0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                    ,"retry_control_set_option",0x19a,1,
                    "Failed to set option \'%s\' (value must be equal or greater to 1)",name);
        }
        l._4_4_ = 0x19b;
      }
      else {
        retry_control_handle->initial_wait_time_in_secs = *value;
        l._4_4_ = 0;
      }
    }
    else {
      iVar1 = strcmp(RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT,name);
      if (iVar1 == 0) {
        if (*value < 0x65) {
          retry_control_handle->max_jitter_percent = *value;
          l._4_4_ = 0;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                      ,"retry_control_set_option",0x1aa,1,
                      "Failed to set option \'%s\' (value must be in the range 0 to 100)",name);
          }
          l._4_4_ = 0x1ab;
        }
      }
      else {
        iVar1 = strcmp(RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS,name);
        if (iVar1 == 0) {
          retry_control_handle->max_delay_in_secs = *value;
          l._4_4_ = 0;
        }
        else {
          iVar1 = strcmp(RETRY_CONTROL_OPTION_SAVED_OPTIONS,name);
          if (iVar1 == 0) {
            OVar2 = OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value,retry_control_handle);
            if (OVar2 == OPTIONHANDLER_OK) {
              l._4_4_ = 0;
            }
            else {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                          ,"retry_control_set_option",0x1be,1,
                          "messenger_set_option failed (OptionHandler_FeedOptions failed)");
              }
              l._4_4_ = 0x1bf;
            }
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                        ,"retry_control_set_option",0x1c8,1,
                        "messenger_set_option failed (option with name \'%s\' is not suppported)",
                        name);
            }
            l._4_4_ = 0x1c9;
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

int retry_control_set_option(RETRY_CONTROL_HANDLE retry_control_handle, const char* name, const void* value)
{
    int result;

    if (retry_control_handle == NULL || name == NULL || value == NULL)
    {
        LogError("Failed to set option (either retry_state_handle (%p), name (%p) or value (%p) are NULL)", retry_control_handle, name, value);
        result = MU_FAILURE;
    }
    else
    {
        RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

        if (strcmp(RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, name) == 0)
        {
            unsigned int cast_value = *((unsigned int*)value);

            if (cast_value < 1)
            {
                LogError("Failed to set option '%s' (value must be equal or greater to 1)", name);
                result = MU_FAILURE;
            }
            else
            {
                retry_control->initial_wait_time_in_secs = cast_value;

                result = RESULT_OK;
            }
        }
        else if (strcmp(RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT, name) == 0)
        {
            unsigned int cast_value = *((unsigned int*)value);

            if (cast_value > 100) // it's unsigned int, it doesn't need to be checked for less than zero.
            {
                LogError("Failed to set option '%s' (value must be in the range 0 to 100)", name);
                result = MU_FAILURE;
            }
            else
            {
                retry_control->max_jitter_percent = cast_value;

                result = RESULT_OK;
            }
        }
        else if (strcmp(RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS, name) == 0)
        {
            retry_control->max_delay_in_secs = *((unsigned int*)value);

            result = RESULT_OK;
        }
        else if (strcmp(RETRY_CONTROL_OPTION_SAVED_OPTIONS, name) == 0)
        {
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, retry_control_handle) != OPTIONHANDLER_OK)
            {
                LogError("messenger_set_option failed (OptionHandler_FeedOptions failed)");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else
        {
            LogError("messenger_set_option failed (option with name '%s' is not suppported)", name);
            result = MU_FAILURE;
        }
    }

    return result;
}